

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_3dVector * __thiscall ON_3dVector::operator=(ON_3dVector *this,double *v)

{
  if (v != (double *)0x0) {
    this->x = *v;
    this->y = v[1];
    this->z = v[2];
    return this;
  }
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  return this;
}

Assistant:

ON_3dVector& ON_3dVector::operator=(const double* v)
{
  if ( v ) {
    x = v[0];
    y = v[1];
    z = v[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}